

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_test.cc
# Opt level: O0

void test_function_4ms(void)

{
  LatencyCollectWrapper LCW__func_latency__;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  LatencyCollector *in_stack_ffffffffffffffa8;
  LatencyCollectWrapper *in_stack_ffffffffffffffb0;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffffc0;
  string local_38 [24];
  LatencyCollectWrapper *in_stack_ffffffffffffffe0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"test_function_4ms",(allocator *)&stack0xffffffffffffffc7);
  LatencyCollectWrapper::LatencyCollectWrapper
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (string *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&stack0xffffffffffffffa8,
             (int *)&stack0xffffffffffffffa4);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_ffffffffffffffc0);
  inner_function();
  LatencyCollectWrapper::~LatencyCollectWrapper(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void test_function_4ms() {
    collectFuncLatency(global_lat);
    std::this_thread::sleep_for(std::chrono::milliseconds(3));
    inner_function();
}